

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O0

bool Js::VarIsImpl<Js::ActivationObject>(RecyclableObject *instance)

{
  bool bVar1;
  undefined1 local_11;
  RecyclableObject *instance_local;
  
  bVar1 = VirtualTableInfo<Js::ActivationObject>::HasVirtualTable(instance);
  local_11 = true;
  if (!bVar1) {
    bVar1 = VirtualTableInfo<Js::CrossSiteObject<Js::ActivationObject>_>::HasVirtualTable(instance);
    local_11 = true;
    if (!bVar1) {
      bVar1 = VirtualTableInfo<Js::ActivationObjectEx>::HasVirtualTable(instance);
      local_11 = true;
      if (!bVar1) {
        bVar1 = VirtualTableInfo<Js::CrossSiteObject<Js::ActivationObjectEx>_>::HasVirtualTable
                          (instance);
        local_11 = true;
        if (!bVar1) {
          bVar1 = VirtualTableInfo<Js::PseudoActivationObject>::HasVirtualTable(instance);
          local_11 = true;
          if (!bVar1) {
            bVar1 = VirtualTableInfo<Js::CrossSiteObject<Js::PseudoActivationObject>_>::
                    HasVirtualTable(instance);
            local_11 = true;
            if (!bVar1) {
              bVar1 = VirtualTableInfo<Js::BlockActivationObject>::HasVirtualTable(instance);
              local_11 = true;
              if (!bVar1) {
                bVar1 = VirtualTableInfo<Js::CrossSiteObject<Js::BlockActivationObject>_>::
                        HasVirtualTable(instance);
                local_11 = true;
                if (!bVar1) {
                  bVar1 = VirtualTableInfo<Js::ConsoleScopeActivationObject>::HasVirtualTable
                                    (instance);
                  local_11 = true;
                  if (!bVar1) {
                    local_11 = VirtualTableInfo<Js::CrossSiteObject<Js::ConsoleScopeActivationObject>_>
                               ::HasVirtualTable(instance);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool VarIsImpl<ActivationObject>(RecyclableObject* instance)
    {
        return VirtualTableInfo<ActivationObject>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<ActivationObject>>::HasVirtualTable(instance) ||
            VirtualTableInfo<ActivationObjectEx>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<ActivationObjectEx>>::HasVirtualTable(instance) ||
            VirtualTableInfo<PseudoActivationObject>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<PseudoActivationObject>>::HasVirtualTable(instance) ||
            VirtualTableInfo<BlockActivationObject>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<BlockActivationObject>>::HasVirtualTable(instance) ||
            VirtualTableInfo<ConsoleScopeActivationObject>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<ConsoleScopeActivationObject>>::HasVirtualTable(instance);
    }